

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateFractionStem
               (int32_t minFrac,int32_t maxFrac,UnicodeString *sb,UErrorCode *param_4)

{
  ConstChar16Ptr local_30 [3];
  
  if (maxFrac == 0 && minFrac == 0) {
    local_30[0].p_ = L"precision-integer";
    UnicodeString::append(sb,local_30,-1);
    return;
  }
  UnicodeString::append(sb,L'.');
  anon_unknown.dwarf_19ea85::appendMultiple(sb,0x30,minFrac);
  if (maxFrac != -1) {
    anon_unknown.dwarf_19ea85::appendMultiple(sb,0x23,maxFrac - minFrac);
    return;
  }
  UnicodeString::append(sb,L'+');
  return;
}

Assistant:

void
blueprint_helpers::generateFractionStem(int32_t minFrac, int32_t maxFrac, UnicodeString& sb, UErrorCode&) {
    if (minFrac == 0 && maxFrac == 0) {
        sb.append(u"precision-integer", -1);
        return;
    }
    sb.append(u'.');
    appendMultiple(sb, u'0', minFrac);
    if (maxFrac == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxFrac - minFrac);
    }
}